

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,Parameters *parameters)

{
  Client *client;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Url local_40;
  
  client = this->client_;
  getUrl(&local_40,this,path);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::_Function_handler<$ff8c07cd$>::_M_invoke;
  local_58 = std::_Function_handler<$ff8c07cd$>::_M_manager;
  HttpConsumer::post(__return_storage_ptr__,client,&local_40,parameters,(JsonProducer *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::create(const Vault::Path &path, const Parameters &parameters) {
  return Vault::HttpConsumer::post(
      client_, getUrl(path), parameters, [&](const Parameters &params) {
        nlohmann::json json;
        json["data"] = helpers::create_json(params);
        return json.dump();
      });
}